

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::precision
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78;
  UCurrencyUsage local_6c;
  UCurrencyUsage usage;
  PrecisionUnion *local_60;
  IncrementSettings *impl_3;
  FractionSignificantSettings *impl_2;
  FractionSignificantSettings *impl_1;
  FractionSignificantSettings *impl;
  ConstChar16Ptr local_30;
  UErrorCode *local_28;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  local_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  if ((macros->precision).fType == RND_NONE) {
    ConstChar16Ptr::ConstChar16Ptr(&local_30,L"precision-unlimited");
    UnicodeString::append(sb,&local_30,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_30);
  }
  else if ((macros->precision).fType == RND_FRACTION) {
    impl_1 = (FractionSignificantSettings *)&(macros->precision).fUnion;
    blueprint_helpers::generateFractionStem
              ((int)impl_1->fMinFrac,(int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,status);
  }
  else if ((macros->precision).fType == RND_SIGNIFICANT) {
    impl_2 = (FractionSignificantSettings *)&(macros->precision).fUnion;
    blueprint_helpers::generateDigitsStem
              ((int)(macros->precision).fUnion.fracSig.fMinSig,
               (int)(macros->precision).fUnion.fracSig.fMaxSig,sb,status);
  }
  else if ((macros->precision).fType == RND_FRACTION_SIGNIFICANT) {
    impl_3 = (IncrementSettings *)&(macros->precision).fUnion;
    blueprint_helpers::generateFractionStem
              ((int)((FractionSignificantSettings *)impl_3)->fMinFrac,
               (int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,status);
    UnicodeString::append((UnicodeString *)status_local,L'/');
    if (*(short *)((long)&impl_3->fIncrement + 4) == -1) {
      blueprint_helpers::generateDigitsStem
                (1,(int)*(short *)((long)&impl_3->fIncrement + 6),(UnicodeString *)status_local,
                 local_28);
    }
    else {
      blueprint_helpers::generateDigitsStem
                ((int)*(short *)((long)&impl_3->fIncrement + 4),-1,(UnicodeString *)status_local,
                 local_28);
    }
  }
  else if ((macros->precision).fType == RND_INCREMENT) {
    local_60 = &(macros->precision).fUnion;
    ConstChar16Ptr::ConstChar16Ptr
              ((ConstChar16Ptr *)&stack0xffffffffffffff98,L"precision-increment/");
    UnicodeString::append(sb,(ConstChar16Ptr *)&stack0xffffffffffffff98,-1);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff98);
    blueprint_helpers::generateIncrementOption
              ((local_60->increment).fIncrement,
               (int)(local_60->increment).fMinFrac - (int)(local_60->increment).fMaxFrac,
               (UnicodeString *)status_local,local_28);
  }
  else {
    if ((macros->precision).fType != RND_CURRENCY) {
      return false;
    }
    local_6c = (macros->precision).fUnion.currencyUsage;
    if (local_6c == UCURR_USAGE_STANDARD) {
      ConstChar16Ptr::ConstChar16Ptr(&local_78,L"precision-currency-standard");
      UnicodeString::append(sb,&local_78,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_78);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_80,L"precision-currency-cash");
      UnicodeString::append(sb,&local_80,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
    }
  }
  return true;
}

Assistant:

bool GeneratorHelpers::precision(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.precision.fType == Precision::RND_NONE) {
        sb.append(u"precision-unlimited", -1);
    } else if (macros.precision.fType == Precision::RND_FRACTION) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
    } else if (macros.precision.fType == Precision::RND_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateDigitsStem(impl.fMinSig, impl.fMaxSig, sb, status);
    } else if (macros.precision.fType == Precision::RND_FRACTION_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
        sb.append(u'/');
        if (impl.fMinSig == -1) {
            blueprint_helpers::generateDigitsStem(1, impl.fMaxSig, sb, status);
        } else {
            blueprint_helpers::generateDigitsStem(impl.fMinSig, -1, sb, status);
        }
    } else if (macros.precision.fType == Precision::RND_INCREMENT) {
        const Precision::IncrementSettings& impl = macros.precision.fUnion.increment;
        sb.append(u"precision-increment/", -1);
        blueprint_helpers::generateIncrementOption(
                impl.fIncrement,
                impl.fMinFrac - impl.fMaxFrac,
                sb,
                status);
    } else if (macros.precision.fType == Precision::RND_CURRENCY) {
        UCurrencyUsage usage = macros.precision.fUnion.currencyUsage;
        if (usage == UCURR_USAGE_STANDARD) {
            sb.append(u"precision-currency-standard", -1);
        } else {
            sb.append(u"precision-currency-cash", -1);
        }
    } else {
        // Bogus or Error
        return false;
    }

    // NOTE: Always return true for rounding because the default value depends on other options.
    return true;
}